

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

ON_Curve * __thiscall ON_PolyCurve::ExplodeSingleSegmentCurve(ON_PolyCurve *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_PolyCurve *pOVar2;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  ON_Interval domain;
  ON_Object *p;
  
  if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count == 1) {
    iVar1 = (*((*(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a)->super_ON_Geometry).
              super_ON_Object._vptr_ON_Object[0x24])();
    p = (ON_Object *)CONCAT44(extraout_var,iVar1);
    if (p != (ON_Object *)0x0) {
      pOVar2 = Cast(p);
      if (pOVar2 == (ON_PolyCurve *)0x0) {
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
        domain.m_t[1] = in_XMM1_Qa;
        domain.m_t[0] = extraout_XMM0_Qa;
        ON_Curve::SetDomain((ON_Curve *)p,domain);
        ON_Object::CopyUserData(p,(ON_Object *)this,(ON_UUID)ZEXT816((ulong)0),source_object);
        return (ON_Curve *)p;
      }
      (*p->_vptr_ON_Object[4])(p);
    }
  }
  return (ON_Curve *)0x0;
}

Assistant:

ON_Curve* ON_PolyCurve::ExplodeSingleSegmentCurve() const

{
  if (Count() != 1)
    return 0;
  ON_Curve* pSeg = SegmentCurve(0)->DuplicateCurve();
  if (!pSeg)
    return 0;
  ON_PolyCurve* pSegPly = ON_PolyCurve::Cast(pSeg);
  if (pSegPly){
    delete pSeg;
    return 0;
  }
  pSeg->SetDomain(Domain());
  pSeg->CopyUserData(*this,ON_nil_uuid,ON_Object::UserDataConflictResolution::source_object);
  return pSeg;
}